

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::adc_a_h(CPU *this)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  Registers *pRVar4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  
  pRVar4 = this->regs;
  bVar2 = pRVar4->h;
  uVar6 = pRVar4->f >> 4 & 1;
  pRVar4->f = '\0';
  bVar3 = pRVar4->a;
  uVar9 = (bVar2 & 0xf) + (bVar3 & 0xf) + uVar6;
  uVar7 = (uint)bVar2 + (uint)bVar3 + uVar6;
  if ((0xf < uVar9) || (0xff < uVar7)) {
    bVar8 = 0x20;
    if (0xff < uVar7) {
      bVar8 = (0xf < uVar9) << 5 | 0x10;
    }
    pRVar4->f = bVar8;
  }
  uVar5 = bVar2 + (char)uVar6 + bVar3;
  pRVar4->a = uVar5;
  if (uVar5 == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 1;
}

Assistant:

int CPU::adc_a_h() {
    adc_r8_r8(regs.a, regs.h);
    return 1;
}